

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O0

void * cnn::cnn_mm_malloc(size_t n,size_t align)

{
  int iVar1;
  ostream *poVar2;
  void *this;
  out_of_memory *this_00;
  ulong in_RSI;
  size_t in_RDI;
  void *ptr;
  string *in_stack_ffffffffffffff78;
  allocator local_59;
  string local_58 [32];
  void *local_38;
  ulong local_30;
  size_t local_28;
  void *local_20;
  size_t local_18;
  void *local_8;
  
  local_38 = (void *)0x0;
  local_30 = in_RSI;
  local_28 = in_RDI;
  local_18 = in_RSI;
  if (in_RSI == 1) {
    local_8 = malloc(in_RDI);
  }
  else {
    if (((in_RSI & in_RSI - 1) == 0) && (in_RSI < 8)) {
      local_18 = 8;
    }
    iVar1 = posix_memalign(&local_20,local_18,in_RDI);
    if (iVar1 == 0) {
      local_8 = local_20;
    }
    else {
      local_8 = (void *)0x0;
    }
  }
  local_38 = local_8;
  if (local_8 == (void *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Memory allocation failed n=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
    poVar2 = std::operator<<(poVar2," align=");
    this = (void *)std::ostream::operator<<(poVar2,local_30);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    this_00 = (out_of_memory *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Memory allocation failed in cnn_mm_malloc()",&local_59);
    out_of_memory::out_of_memory(this_00,in_stack_ffffffffffffff78);
    __cxa_throw(this_00,&out_of_memory::typeinfo,out_of_memory::~out_of_memory);
  }
  return local_8;
}

Assistant:

inline void* cnn_mm_malloc(size_t n, size_t align) {
  void* ptr = nullptr;
#if HAVE_CUDA
  CUDA_CHECK(cudaMalloc(&ptr, n));
#else
  ptr = _mm_malloc(n, align);
#endif
  if (!ptr) {
    std::cerr << "Memory allocation failed n=" << n << " align=" << align << std::endl;
    throw cnn::out_of_memory("Memory allocation failed in cnn_mm_malloc()");
  }
  return ptr;
}